

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_settc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  char *local_58;
  char *ep;
  long i;
  char how [8];
  char what [8];
  termcapval *tv;
  termcapstr *ts;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  if (((argv == (wchar_t **)0x0) || (argv[1] == (wchar_t *)0x0)) || (argv[2] == (wchar_t *)0x0)) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    pcVar3 = ct_encode_string(argv[1],&el->el_scratch);
    strlcpy(how,pcVar3,8);
    pcVar3 = ct_encode_string(argv[2],&el->el_scratch);
    strlcpy((char *)&i,pcVar3,8);
    tv = (termcapval *)tstr;
    while ((tv->name != (char *)0x0 && (iVar1 = strcmp(tv->name,how), iVar1 != 0))) {
      tv = tv + 1;
    }
    if (tv->name == (char *)0x0) {
      what = (char  [8])tval;
      while ((*(long *)what != 0 && (iVar1 = strcmp(*(char **)what,how), iVar1 != 0))) {
        what = (char  [8])((long)what + 0x10);
      }
      if (*(long *)what == 0) {
        fprintf((FILE *)el->el_errfile,"%ls: Bad capability `%s\'.\n",*argv,how);
        el_local._4_4_ = L'\xffffffff';
      }
      else if ((((what == (char  [8])0x1337e0) || (what == (char  [8])0x133810)) ||
               (what == (char  [8])tval)) || (what == (char  [8])0x133830)) {
        iVar1 = strcmp((char *)&i,"yes");
        if (iVar1 == 0) {
          (el->el_terminal).t_val[(long)what + -0x1337d0 >> 4] = L'\x01';
        }
        else {
          iVar1 = strcmp((char *)&i,"no");
          if (iVar1 != 0) {
            fprintf((FILE *)el->el_errfile,"%ls: Bad value `%s\'.\n",*argv,&i);
            return L'\xffffffff';
          }
          (el->el_terminal).t_val[(long)what + -0x1337d0 >> 4] = L'\0';
        }
        terminal_setflags(el);
        el_local._4_4_ = L'\0';
      }
      else {
        ep = (char *)strtol((char *)&i,&local_58,10);
        if (*local_58 == '\0') {
          (el->el_terminal).t_val[(long)what + -0x1337d0 >> 4] = (wchar_t)ep;
          if (what == (char  [8])0x133800) {
            (el->el_terminal).t_size.v = (el->el_terminal).t_val[3];
            ep = (char *)0x1;
          }
          else {
            if (what == (char  [8])0x1337f0) {
              (el->el_terminal).t_size.h = (el->el_terminal).t_val[2];
            }
            ep = (char *)(ulong)(what == (char  [8])0x1337f0);
          }
          if ((ep == (char *)0x0) ||
             (wVar2 = terminal_change_size(el,(el->el_terminal).t_val[2],(el->el_terminal).t_val[3])
             , wVar2 != L'\xffffffff')) {
            el_local._4_4_ = L'\0';
          }
          else {
            el_local._4_4_ = L'\xffffffff';
          }
        }
        else {
          fprintf((FILE *)el->el_errfile,"%ls: Bad value `%s\'.\n",*argv,&i);
          el_local._4_4_ = L'\xffffffff';
        }
      }
    }
    else {
      terminal_alloc(el,(termcapstr *)tv,(char *)&i);
      terminal_setflags(el);
      el_local._4_4_ = L'\0';
    }
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_settc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char what[8], how[8];
	long i;
	char *ep;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	strlcpy(what, ct_encode_string(argv[1], &el->el_scratch), sizeof(what));
	strlcpy(how,  ct_encode_string(argv[2], &el->el_scratch), sizeof(how));

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		terminal_alloc(el, ts, how);
		terminal_setflags(el);
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad capability `%s'.\n", argv[0], what);
		return -1;
	}

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		/*
		 * Booleans
		 */
		if (strcmp(how, "yes") == 0)
			el->el_terminal.t_val[tv - tval] = 1;
		else if (strcmp(how, "no") == 0)
			el->el_terminal.t_val[tv - tval] = 0;
		else {
			(void) fprintf(el->el_errfile,
			    "%ls: Bad value `%s'.\n", argv[0], how);
			return -1;
		}
		terminal_setflags(el);
		return 0;
	}

	/*
	 * Numerics
	 */
	i = strtol(how, &ep, 10);
	if (*ep != '\0') {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad value `%s'.\n", argv[0], how);
		return -1;
	}
	el->el_terminal.t_val[tv - tval] = (int) i;
	i = 0;
	if (tv == &tval[T_co]) {
		el->el_terminal.t_size.v = Val(T_co);
		i++;
	} else if (tv == &tval[T_li]) {
		el->el_terminal.t_size.h = Val(T_li);
		i++;
	}
	if (i && terminal_change_size(el, Val(T_li), Val(T_co)) == -1)
		return -1;
	return 0;
}